

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFParser.cpp
# Opt level: O1

IByteReader * __thiscall
PDFParser::WrapWithDecryptionFilter
          (PDFParser *this,PDFStreamInput *inStream,IByteReader *inToWrapStream)

{
  DecryptionHelper *this_00;
  IPDFParserExtender *pIVar1;
  bool bVar2;
  char cVar3;
  IByteReader *pIVar4;
  IByteReader *pIVar5;
  
  this_00 = &this->mDecryptionHelper;
  bVar2 = DecryptionHelper::IsEncrypted(this_00);
  pIVar4 = inToWrapStream;
  if ((bVar2) &&
     (((bVar2 = DecryptionHelper::CanDecryptDocument(this_00), bVar2 ||
       ((this->mParserExtender != (IPDFParserExtender *)0x0 &&
        (cVar3 = (**(code **)(*(long *)this->mParserExtender + 0x18))(), cVar3 != '\0')))) &&
      (pIVar4 = DecryptionHelper::CreateDefaultDecryptionFilterForStream
                          (this_00,inStream,inToWrapStream), pIVar4 == (IByteReader *)0x0)))) {
    pIVar1 = this->mParserExtender;
    if (pIVar1 == (IPDFParserExtender *)0x0) {
      pIVar5 = (IByteReader *)0x0;
    }
    else {
      pIVar5 = (IByteReader *)(**(code **)(*(long *)pIVar1 + 0x20))(pIVar1,inStream,inToWrapStream);
    }
    pIVar4 = inToWrapStream;
    if (pIVar5 != (IByteReader *)0x0) {
      pIVar4 = pIVar5;
    }
  }
  return pIVar4;
}

Assistant:

IByteReader* PDFParser::WrapWithDecryptionFilter(PDFStreamInput* inStream, IByteReader* inToWrapStream) {
	if (IsEncrypted() && IsEncryptionSupported()) {
		// try with decryption helper
		IByteReader*  result = 	mDecryptionHelper.CreateDefaultDecryptionFilterForStream(inStream, inToWrapStream);
		if (result)
			return result;

		// try with extender
		if(mParserExtender)
			result = mParserExtender->CreateDefaultDecryptionFilterForStream(inStream, inToWrapStream);

		if (result)
			return result;
		else
			return inToWrapStream;
	}
	else {
		return inToWrapStream;
	}
}